

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dispatch_init<unsigned_int>
               (ident_t *loc,int gtid,sched_type schedule,uint lb,uint ub,signed_t st,signed_t chunk
               ,int push_ws)

{
  uint uVar1;
  unsigned_t uVar2;
  char *msg;
  char *file;
  kmp_int32 *pkVar3;
  uint in_ECX;
  sched_type in_EDX;
  char *in_RSI;
  ident_t *in_RDI;
  uint in_R8D;
  uint in_R9D;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  uint in_stack_00000008;
  int in_stack_00000010;
  uint *p_1;
  kmp_uint64 schedtype;
  uint parm4;
  uint parm3;
  uint parm2;
  uint parm1;
  longdouble p;
  UT mid;
  UT right;
  UT left;
  UT cross;
  longdouble target;
  DBL x;
  uint nproc_3;
  uint nproc_2;
  uint ub_tmp;
  uint extras_1;
  uint small_chunk_1;
  uint id_1;
  uint limit;
  uint init_1;
  uint nproc_1;
  uint extras;
  uint small_chunk;
  uint id;
  uint init;
  uint ntc;
  uint nproc;
  cons_type ws;
  int itt_need_metadata_reporting;
  kmp_uint64 cur_chunk;
  dispatch_shared_info_template<unsigned_int> *sh;
  dispatch_private_info_template<unsigned_int> *pr;
  kmp_uint32 my_buffer_index;
  kmp_team_t *team;
  kmp_info_t *th;
  uint tc;
  int active;
  ident_t *in_stack_fffffffffffffdc8;
  undefined2 in_stack_fffffffffffffdd0;
  undefined2 in_stack_fffffffffffffdd2;
  int in_stack_fffffffffffffdd4;
  ident_t *in_stack_fffffffffffffdd8;
  void *in_stack_fffffffffffffde0;
  _func_kmp_uint32_uint_uint *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  uint *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  uint in_stack_fffffffffffffe20;
  uint uVar7;
  uint local_1dc;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  cons_type in_stack_fffffffffffffe30;
  kmp_i18n_id_t in_stack_fffffffffffffe34;
  dispatch_private_info_t *in_stack_fffffffffffffe48;
  dispatch_shared_info_t *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 uVar8;
  ident_t *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  void *local_158;
  _func_kmp_uint32_uint_uint *local_150;
  undefined8 local_148;
  uint uStack_144;
  undefined1 local_140 [24];
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  longdouble local_118;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  longdouble local_f8;
  double local_e0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  int local_a8;
  uint local_a4;
  uint local_a0;
  cons_type local_9c;
  kmp_msg_t local_98;
  ident_t *local_80 [2];
  ident_t *local_70;
  uint local_64;
  ulong local_60;
  dispatch_shared_info_t *local_58;
  dispatch_private_info_t *local_50;
  uint local_44;
  kmp_team_p *local_40;
  kmp_info_t *local_38;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  sched_type local_18;
  int local_14;
  ident_t *local_10;
  
  local_14 = (int)in_RSI;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_10 = in_RDI;
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  local_38 = __kmp_threads[local_14];
  local_40 = (local_38->th).th_team;
  local_28 = (uint)(((local_40->t).t_serialized != 0 ^ 0xffU) & 1);
  (local_38->th).th_ident = local_10;
  local_60 = (ulong)(int)in_stack_00000008;
  uVar8 = false;
  if ((((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
       (uVar8 = false, __kmp_forkjoin_frames_mode == 3)) &&
      (uVar8 = false, *(int *)(__kmp_threads[local_14]->th_pad + 0x20) == 0)) &&
     (uVar8 = false, (local_38->th).th_teams_microtask == (microtask_t)0x0)) {
    uVar8 = (local_40->t).t_active_level == 1;
  }
  local_64 = (uint)(byte)uVar8;
  if (local_28 == 0) {
    local_50 = ((local_38->th).th_dispatch)->th_disp_buffer;
  }
  else {
    local_44 = ((local_38->th).th_dispatch)->th_disp_index;
    ((local_38->th).th_dispatch)->th_disp_index = local_44 + 1;
    in_stack_fffffffffffffe48 = ((local_38->th).th_dispatch)->th_disp_buffer;
    local_50 = in_stack_fffffffffffffe48 + (ulong)local_44 % (ulong)(uint)__kmp_dispatch_num_buffers
    ;
    in_stack_fffffffffffffe50 = (local_40->t).t_disp_buffer;
    local_58 = in_stack_fffffffffffffe50 + (ulong)local_44 % (ulong)(uint)__kmp_dispatch_num_buffers
    ;
  }
  local_18 = local_18 & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  if (((int)local_18 < 0xa0) || (199 < (int)local_18)) {
    local_50->nomerge = 0;
  }
  else {
    local_50->nomerge = 1;
    local_18 = local_18 - 0x80;
  }
  local_50->type_size = 4;
  if ((local_18 & kmp_ord_lower) == 0) {
    local_50->ordered = 0;
  }
  else {
    local_50->ordered = 1;
    local_18 = local_18 - kmp_sch_lower;
  }
  if (local_18 == kmp_sch_default) {
    local_18 = __kmp_static;
  }
  else {
    if (local_18 == kmp_sch_runtime) {
      local_18 = (local_40->t).t_sched.r_sched_type;
      if (local_18 == kmp_sch_guided_chunked) {
        local_18 = __kmp_guided;
      }
      else if (local_18 == kmp_sch_default) {
        local_18 = __kmp_static;
      }
      in_stack_00000008 = (local_40->t).t_sched.chunk;
      local_60 = (ulong)(int)in_stack_00000008;
    }
    else {
      if (local_18 == kmp_sch_guided_chunked) {
        local_18 = __kmp_guided;
      }
      if ((int)in_stack_00000008 < 1) {
        in_stack_00000008 = 1;
      }
    }
    if (local_18 == kmp_sch_auto) {
      local_18 = __kmp_auto;
    }
    if ((0x100000 < (local_40->t).t_nproc) && (local_18 == kmp_sch_guided_analytical_chunked)) {
      local_18 = kmp_sch_guided_iterative_chunked;
      in_RSI = (char *)0x40059;
      __kmp_msg_format((kmp_i18n_id_t)local_80);
      local_98.type = __kmp_msg_null.type;
      local_98.num = __kmp_msg_null.num;
      local_98.str = __kmp_msg_null.str;
      local_98.len = __kmp_msg_null.len;
      local_98._20_4_ = __kmp_msg_null._20_4_;
      in_stack_fffffffffffffdd0 = SUB82(local_80[1],0);
      in_stack_fffffffffffffdd2 = (undefined2)((ulong)local_80[1] >> 0x10);
      in_stack_fffffffffffffdd4 = (int)((ulong)local_80[1] >> 0x20);
      in_stack_fffffffffffffde0 = (void *)__kmp_msg_null._0_8_;
      in_stack_fffffffffffffde8 = (_func_kmp_uint32_uint_uint *)__kmp_msg_null.str;
      in_stack_fffffffffffffdf0 = __kmp_msg_null._16_8_;
      __kmp_msg(kmp_ms_warning);
      in_stack_fffffffffffffdc8 = local_80[0];
      in_stack_fffffffffffffdd8 = local_70;
    }
    (local_50->u).p32.field_6.parm1 = in_stack_00000008;
  }
  if (((int)local_18 < 0x21) || (0x2d < (int)local_18)) {
    in_RSI = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_dispatch.cpp"
    ;
    __kmp_debug_assert(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                       (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  (local_50->u).p32.count = 0;
  if ((__kmp_env_consistency_check != 0) && (local_24 == 0)) {
    in_RSI = (char *)0x2;
    if (local_50->ordered != 0) {
      in_RSI = (char *)0x3;
    }
    __kmp_error_construct
              (in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
               (ident_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  }
  if (local_24 == 1) {
    if (local_20 < local_1c) {
      local_2c = 0;
    }
    else {
      local_2c = (local_20 - local_1c) + 1;
    }
  }
  else if ((int)local_24 < 0) {
    if (local_1c < local_20) {
      local_2c = 0;
    }
    else {
      local_2c = (local_1c - local_20) / -local_24 + 1;
    }
  }
  else if (local_20 < local_1c) {
    local_2c = 0;
  }
  else {
    local_2c = (local_20 - local_1c) / local_24 + 1;
  }
  (local_50->u).p32.lb = local_1c;
  *(uint *)((long)&local_50->u + 4) = local_20;
  (local_50->u).p32.st = local_24;
  (local_50->u).p32.tc = local_2c;
  if (local_28 != 0) {
    if (local_50->ordered == 0) {
      ((local_38->th).th_dispatch)->th_deo_fcn = __kmp_dispatch_deo_error;
      ((local_38->th).th_dispatch)->th_dxo_fcn = __kmp_dispatch_dxo_error;
    }
    else {
      local_50->ordered_bumped = 0;
      (local_50->u).p32.ordered_lower = 1;
      (local_50->u).p32.ordered_upper = 0;
      ((local_38->th).th_dispatch)->th_deo_fcn = __kmp_dispatch_deo<unsigned_int>;
      ((local_38->th).th_dispatch)->th_dxo_fcn = __kmp_dispatch_dxo<unsigned_int>;
    }
  }
  if (__kmp_env_consistency_check != 0) {
    local_9c = ct_pdo;
    if (local_50->ordered != 0) {
      local_9c = ct_pdo_ordered;
    }
    if (in_stack_00000010 == 0) {
      in_RSI = (char *)(ulong)local_9c;
      __kmp_check_workshare
                (in_stack_fffffffffffffdd4,
                 CONCAT22(in_stack_fffffffffffffdd2,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8);
      local_50->pushed_ws = ct_none;
    }
    else {
      in_RSI = (char *)(ulong)local_9c;
      __kmp_push_workshare
                ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                 (cons_type)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      local_50->pushed_ws = local_9c;
    }
  }
  uVar7 = SUB84(in_stack_fffffffffffffdf0,4);
  switch(local_18) {
  case kmp_sch_static_chunked:
  case kmp_sch_dynamic_chunked:
    if ((local_50->u).p32.field_6.parm1 == 0) {
      (local_50->u).p32.field_6.parm1 = 1;
    }
    break;
  default:
    __kmp_msg_format((kmp_i18n_id_t)local_140,0x40058);
    __kmp_msg_format((kmp_i18n_id_t)&local_158,0x50016);
    in_stack_fffffffffffffdf8 = (uint *)__kmp_msg_null._0_8_;
    uVar7 = uStack_144;
    __kmp_msg(kmp_ms_fatal);
    in_stack_fffffffffffffde0 = local_158;
    in_stack_fffffffffffffde8 = local_150;
    break;
  case kmp_sch_trapezoidal:
    local_11c = in_stack_00000008;
    local_120 = local_2c / (uint)((local_40->t).t_nproc << 1);
    if (local_120 == 0) {
      local_120 = 1;
    }
    if (in_stack_00000008 == 0) {
      local_11c = 1;
    }
    else if (local_120 < in_stack_00000008) {
      local_11c = local_120;
    }
    local_124 = ((local_2c * 2 + local_120 + local_11c) - 1) / (local_120 + local_11c);
    if (local_124 < 2) {
      local_124 = 2;
    }
    local_128 = (local_120 - local_11c) / (local_124 - 1);
    (local_50->u).p32.field_6.parm1 = local_11c;
    (local_50->u).p32.field_6.parm2 = local_120;
    (local_50->u).p32.field_6.parm3 = local_124;
    (local_50->u).p32.field_6.parm4 = local_128;
    break;
  case kmp_sch_static_greedy:
    uVar1 = local_2c;
    if (1 < (local_40->t).t_nproc) {
      uVar1 = ((local_2c + (local_40->t).t_nproc) - 1) / (uint)(local_40->t).t_nproc;
    }
    (local_50->u).p32.field_6.parm1 = uVar1;
    break;
  case kmp_sch_static_balanced:
    goto switchD_00191584_caseD_29;
  case kmp_sch_guided_iterative_chunked:
    local_d4 = (local_40->t).t_nproc;
    if (local_d4 < 2) {
      local_18 = kmp_sch_static_greedy;
      (local_50->u).p32.field_6.parm1 = local_2c;
    }
    else if ((long)(((long)(int)in_stack_00000008 * 2 + 1) * (ulong)local_d4) <
             (long)(ulong)local_2c) {
      (local_50->u).p32.field_6.parm2 = guided_int_param * local_d4 * (in_stack_00000008 + 1);
      *(double *)((long)&local_50->u + 0x28) = guided_flt_param / (double)local_d4;
    }
    else {
      local_18 = kmp_sch_dynamic_chunked;
    }
    break;
  case kmp_sch_guided_analytical_chunked:
    local_d8 = (local_40->t).t_nproc;
    if (local_d8 < 2) {
      local_18 = kmp_sch_static_greedy;
      (local_50->u).p32.field_6.parm1 = local_2c;
    }
    else if ((long)(((long)(int)in_stack_00000008 * 2 + 1) * (ulong)local_d8) <
             (long)(ulong)local_2c) {
      msg = (char *)(ulong)local_d8;
      file = (char *)(ulong)local_2c;
      local_f8 = ((longdouble)(long)msg *
                 ((longdouble)(int)in_stack_00000008 + (longdouble)(int)in_stack_00000008 +
                 (longdouble)1)) / (longdouble)(long)file;
      in_stack_fffffffffffffe60 = (ident_t *)(ulong)local_d8;
      local_e0 = (double)((longdouble)-0.5 / (longdouble)(long)in_stack_fffffffffffffe60 +
                         (longdouble)1);
      *(double *)((long)&local_50->u + 0x28) = local_e0;
      local_104 = 0xe5;
      lVar4 = in_ST4;
      lVar5 = in_ST4;
      __kmp_pow<unsigned_int>((longdouble *)0xe5,(longdouble)local_e0,(uint)in_RSI);
      uVar7 = in_stack_fffffffffffffe20;
      local_118 = in_ST0;
      uVar1 = local_104;
      if (in_ST0 <= local_f8) {
        local_100 = 0;
      }
      else {
        do {
          local_104 = uVar1;
          local_118 = local_118 * local_118;
          uVar1 = local_104 << 1;
          in_stack_fffffffffffffe20 = uVar7 & 0xffffff;
          if (local_f8 < local_118) {
            in_stack_fffffffffffffe20 = CONCAT13(uVar1 < 0x8000000,(int3)uVar7);
          }
          uVar7 = in_stack_fffffffffffffe20;
        } while ((char)(in_stack_fffffffffffffe20 >> 0x18) != '\0');
        local_100 = local_104 & 0x7fffffff;
        local_104 = uVar1;
      }
      while( true ) {
        uVar7 = SUB84(in_stack_fffffffffffffdf0,4);
        uVar2 = (unsigned_t)((ulong)in_stack_fffffffffffffe10 >> 0x20);
        uVar1 = (uint)in_RSI;
        if (local_104 <= local_100 + 1) break;
        local_108 = local_100 + local_104 >> 1;
        lVar6 = lVar5;
        __kmp_pow<unsigned_int>((longdouble *)(ulong)local_108,(longdouble)local_e0,uVar1);
        if (in_ST1 <= local_f8) {
          local_104 = local_108;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar4;
          lVar4 = lVar5;
          lVar5 = lVar6;
        }
        else {
          local_100 = local_108;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar4;
          lVar4 = lVar5;
          lVar5 = lVar6;
        }
      }
      local_fc = local_104;
      if (((local_104 == 0) ||
          (__kmp_pow<unsigned_int>((longdouble *)(ulong)(local_104 - 1),(longdouble)local_e0,uVar1),
          in_ST1 <= local_f8)) ||
         (__kmp_pow<unsigned_int>((longdouble *)(ulong)local_fc,(longdouble)local_e0,uVar1),
         local_f8 < in_ST2)) {
        __kmp_debug_assert(msg,file,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      }
      (local_50->u).p32.field_6.parm2 = local_fc;
      uVar1 = local_2c;
      uVar2 = __kmp_dispatch_guided_remaining<unsigned_int>
                        (in_stack_fffffffffffffe20,
                         (floating_t)CONCAT44(local_2c,in_stack_fffffffffffffe18),uVar2);
      (local_50->u).p32.count = (uVar1 - uVar2) - local_fc * in_stack_00000008;
    }
    else {
      local_18 = kmp_sch_dynamic_chunked;
    }
    break;
  case kmp_sch_static_steal:
    local_a0 = (local_40->t).t_nproc;
    local_a4 = (uint)(local_2c % in_stack_00000008 != 0) + local_2c / in_stack_00000008;
    if ((1 < local_a0) && (local_a0 <= local_a4)) {
      local_ac = *(uint *)(__kmp_threads[local_14]->th_pad + 0x20);
      local_b0 = local_a4 / local_a0;
      local_b4 = local_a4 % local_a0;
      uVar1 = local_b4;
      if (local_ac < local_b4) {
        uVar1 = local_ac;
      }
      local_a8 = local_ac * local_b0 + uVar1;
      (local_50->u).p32.count = local_a8;
      (local_50->u).p32.ub = local_a8 + local_b0 + (uint)(local_ac < local_b4);
      (local_50->u).p32.field_6.parm2 = local_1c;
      (local_50->u).p32.field_6.parm4 = local_ac;
      (local_50->u).p32.st = local_24;
      break;
    }
    local_18 = kmp_sch_static_balanced;
switchD_00191584_caseD_29:
    local_b8 = (local_40->t).t_nproc;
    if (local_b8 < 2) {
      if (local_2c == 0) {
        (local_50->u).p32.count = 1;
        (local_50->u).p32.field_6.parm1 = 0;
        break;
      }
      local_bc = 0;
      local_c0 = local_2c - 1;
      (local_50->u).p32.field_6.parm1 = 1;
    }
    else {
      local_c4 = *(uint *)(__kmp_threads[local_14]->th_pad + 0x20);
      if (local_2c < local_b8) {
        if (local_2c <= local_c4) {
          (local_50->u).p32.count = 1;
          (local_50->u).p32.field_6.parm1 = 0;
          break;
        }
        *(uint *)((long)&local_50->u + 0x20) = (uint)(local_c4 == local_2c - 1);
        local_c0 = local_c4;
        local_bc = local_c4;
      }
      else {
        local_c8 = local_2c / local_b8;
        local_cc = local_2c % local_b8;
        local_bc = local_cc;
        if (local_c4 < local_cc) {
          local_bc = local_c4;
        }
        local_bc = local_c4 * local_c8 + local_bc;
        local_c0 = (local_bc + local_c8) - (uint)(local_cc <= local_c4);
        *(uint *)((long)&local_50->u + 0x20) = (uint)(local_c4 == local_b8 - 1);
      }
    }
    if (local_64 != 0) {
      local_60 = (ulong)((local_c0 - local_bc) + 1);
    }
    if (local_24 == 1) {
      (local_50->u).p32.lb = local_1c + local_bc;
      (local_50->u).p32.ub = local_1c + local_c0;
    }
    else {
      local_d0 = local_1c + local_c0 * local_24;
      (local_50->u).p32.lb = local_1c + local_bc * local_24;
      if ((int)local_24 < 1) {
        local_1dc = local_d0;
        if (local_d0 + local_24 < local_20) {
          local_1dc = local_20;
        }
        *(uint *)((long)&local_50->u + 4) = local_1dc;
      }
      else {
        uVar1 = local_d0;
        if (local_20 < local_d0 + local_24) {
          uVar1 = local_20;
        }
        *(uint *)((long)&local_50->u + 4) = uVar1;
      }
    }
    if (local_50->ordered != 0) {
      (local_50->u).p32.ordered_lower = local_bc;
      (local_50->u).p32.ordered_upper = local_c0;
    }
  }
  local_50->schedule = local_18;
  if (local_28 != 0) {
    __kmp_wait_yield<unsigned_int>
              (in_stack_fffffffffffffdf8,uVar7,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    ((local_38->th).th_dispatch)->th_dispatch_pr_current = local_50;
    ((local_38->th).th_dispatch)->th_dispatch_sh_current = local_58;
    if (local_50->ordered != 0) {
      __kmp_itt_ordered_init((int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    }
    if (local_64 != 0) {
      switch(local_18) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced:
        break;
      default:
        break;
      case kmp_sch_dynamic_chunked:
        break;
      case kmp_sch_static_greedy:
        local_60 = (ulong)(uint)(local_50->u).p32.field_6.parm1;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      }
      __kmp_itt_metadata_loop
                (in_stack_fffffffffffffe60,CONCAT17(uVar8,in_stack_fffffffffffffe58),
                 (kmp_uint64)in_stack_fffffffffffffe50,(kmp_uint64)in_stack_fffffffffffffe48);
    }
  }
  if (local_18 == kmp_sch_static_steal) {
    pkVar3 = &(local_50->u).p32.static_steal_counter;
    *pkVar3 = *pkVar3 + 1;
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(
    ident_t                        * loc,
    int                              gtid,
    enum sched_type                  schedule,
    T                                lb,
    T                                ub,
    typename traits_t< T >::signed_t st,
    typename traits_t< T >::signed_t chunk,
    int                              push_ws
) {
    typedef typename traits_t< T >::unsigned_t  UT;
    typedef typename traits_t< T >::signed_t    ST;
    typedef typename traits_t< T >::floating_t  DBL;
    static const int ___kmp_size_type = sizeof( UT );

    int                                            active;
    T                                              tc;
    kmp_info_t *                                   th;
    kmp_team_t *                                   team;
    kmp_uint32                                     my_buffer_index;
    dispatch_private_info_template< T >          * pr;
    dispatch_shared_info_template< UT > volatile * sh;

    KMP_BUILD_ASSERT( sizeof( dispatch_private_info_template< T > ) == sizeof( dispatch_private_info ) );
    KMP_BUILD_ASSERT( sizeof( dispatch_shared_info_template< UT > ) == sizeof( dispatch_shared_info ) );

    if ( ! TCR_4( __kmp_init_parallel ) )
        __kmp_parallel_initialize();

#if INCLUDE_SSC_MARKS
    SSC_MARK_DISPATCH_INIT();
#endif
    #ifdef KMP_DEBUG
    {
        const char * buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d called: schedule:%%d chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
            traits_t< ST >::spec, traits_t< T >::spec, traits_t< T >::spec, traits_t< ST >::spec );
        KD_TRACE(10, ( buff, gtid, schedule, chunk, lb, ub, st ) );
        __kmp_str_free( &buff );
    }
    #endif
    /* setup data */
    th     = __kmp_threads[ gtid ];
    team   = th -> th.th_team;
    active = ! team -> t.t_serialized;
    th->th.th_ident = loc;

#if USE_ITT_BUILD
    kmp_uint64 cur_chunk = chunk;
    int itt_need_metadata_reporting = __itt_metadata_add_ptr && __kmp_forkjoin_frames_mode == 3 &&
        KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
        th->th.th_teams_microtask == NULL &&
#endif
        team->t.t_active_level == 1;
#endif
    if ( ! active ) {
        pr = reinterpret_cast< dispatch_private_info_template< T >* >
            ( th -> th.th_dispatch -> th_disp_buffer ); /* top of the stack */
    } else {
        KMP_DEBUG_ASSERT( th->th.th_dispatch ==
                &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid] );

        my_buffer_index = th->th.th_dispatch->th_disp_index ++;

        /* What happens when number of threads changes, need to resize buffer? */
        pr = reinterpret_cast< dispatch_private_info_template< T >  * >
            ( &th -> th.th_dispatch -> th_disp_buffer[ my_buffer_index % __kmp_dispatch_num_buffers ] );
        sh = reinterpret_cast< dispatch_shared_info_template< UT > volatile * >
            ( &team -> t.t_disp_buffer[ my_buffer_index % __kmp_dispatch_num_buffers ] );
    }

    /* Currently just ignore the monotonic and non-monotonic modifiers (the compiler isn't producing them
     * yet anyway).
     * When it is we'll want to look at them somewhere here and use that information to add to our
     * schedule choice. We shouldn't need to pass them on, they merely affect which schedule we can
     * legally choose for various dynamic cases. (In paritcular, whether or not a stealing scheme is legal).
     */
    schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

    /* Pick up the nomerge/ordered bits from the scheduling type */
    if ( (schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper) ) {
        pr->nomerge = TRUE;
        schedule = (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
    } else {
        pr->nomerge = FALSE;
    }
    pr->type_size = ___kmp_size_type; // remember the size of variables
    if ( kmp_ord_lower & schedule ) {
        pr->ordered = TRUE;
        schedule = (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
    } else {
        pr->ordered = FALSE;
    }

    if ( schedule == kmp_sch_static ) {
        schedule = __kmp_static;
    } else {
        if ( schedule == kmp_sch_runtime ) {
            // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if not specified)
            schedule = team -> t.t_sched.r_sched_type;
            // Detail the schedule if needed (global controls are differentiated appropriately)
            if ( schedule == kmp_sch_guided_chunked ) {
                schedule = __kmp_guided;
            } else if ( schedule == kmp_sch_static ) {
                schedule = __kmp_static;
            }
            // Use the chunk size specified by OMP_SCHEDULE (or default if not specified)
            chunk = team -> t.t_sched.chunk;
#if USE_ITT_BUILD
            cur_chunk = chunk;
#endif
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_init: T#%%d new: schedule:%%d chunk:%%%s\n",
                    traits_t< ST >::spec );
                KD_TRACE(10, ( buff, gtid, schedule, chunk ) );
                __kmp_str_free( &buff );
            }
            #endif
        } else {
            if ( schedule == kmp_sch_guided_chunked ) {
                schedule = __kmp_guided;
            }
            if ( chunk <= 0 ) {
                chunk = KMP_DEFAULT_CHUNK;
            }
        }

        if ( schedule == kmp_sch_auto ) {
            // mapping and differentiation: in the __kmp_do_serial_initialize()
            schedule = __kmp_auto;
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_init: kmp_sch_auto: T#%%d new: schedule:%%d chunk:%%%s\n",
                    traits_t< ST >::spec );
                KD_TRACE(10, ( buff, gtid, schedule, chunk ) );
                __kmp_str_free( &buff );
            }
            #endif
        }

        /* guided analytical not safe for too many threads */
        if ( team->t.t_nproc > 1<<20 && schedule == kmp_sch_guided_analytical_chunked ) {
            schedule = kmp_sch_guided_iterative_chunked;
            KMP_WARNING( DispatchManyThreads );
        }
        pr->u.p.parm1 = chunk;
    }
    KMP_ASSERT2( (kmp_sch_lower < schedule && schedule < kmp_sch_upper),
                "unknown scheduling type" );

    pr->u.p.count = 0;

    if ( __kmp_env_consistency_check ) {
        if ( st == 0 ) {
            __kmp_error_construct(
                kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                ( pr->ordered ? ct_pdo_ordered : ct_pdo ), loc
            );
        }
    }
    // compute trip count
    if ( st == 1 ) {   // most common case
        if ( ub >= lb ) {
            tc = ub - lb + 1;
        } else {   // ub < lb
            tc = 0;            // zero-trip
        }
    } else if ( st < 0 ) {
        if ( lb >= ub ) {
            // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
            //     where the division needs to be unsigned regardless of the result type
            tc = (UT)(lb - ub) / (-st) + 1;
        } else {   // lb < ub
            tc = 0;            // zero-trip
        }
    } else {       // st > 0
        if ( ub >= lb ) {
            // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
            //     where the division needs to be unsigned regardless of the result type
            tc = (UT)(ub - lb) / st + 1;
        } else {   // ub < lb
            tc = 0;            // zero-trip
        }
    }

    // Any half-decent optimizer will remove this test when the blocks are empty since the macros expand to nothing
    // when statistics are disabled.
    if (schedule == __kmp_static)
    {
        KMP_COUNT_BLOCK(OMP_FOR_static);
        KMP_COUNT_VALUE(FOR_static_iterations, tc);
    }
    else
    {
        KMP_COUNT_BLOCK(OMP_FOR_dynamic);
        KMP_COUNT_VALUE(FOR_dynamic_iterations, tc);
    }

    pr->u.p.lb = lb;
    pr->u.p.ub = ub;
    pr->u.p.st = st;
    pr->u.p.tc = tc;

    #if KMP_OS_WINDOWS
    pr->u.p.last_upper = ub + st;
    #endif /* KMP_OS_WINDOWS */

    /* NOTE: only the active parallel region(s) has active ordered sections */

    if ( active ) {
        if ( pr->ordered == 0 ) {
            th -> th.th_dispatch -> th_deo_fcn = __kmp_dispatch_deo_error;
            th -> th.th_dispatch -> th_dxo_fcn = __kmp_dispatch_dxo_error;
        } else {
            pr->ordered_bumped = 0;

            pr->u.p.ordered_lower = 1;
            pr->u.p.ordered_upper = 0;

            th -> th.th_dispatch -> th_deo_fcn = __kmp_dispatch_deo< UT >;
            th -> th.th_dispatch -> th_dxo_fcn = __kmp_dispatch_dxo< UT >;
        }
    }

    if ( __kmp_env_consistency_check ) {
        enum cons_type ws = pr->ordered ? ct_pdo_ordered : ct_pdo;
        if ( push_ws ) {
            __kmp_push_workshare( gtid, ws, loc );
            pr->pushed_ws = ws;
        } else {
            __kmp_check_workshare( gtid, ws, loc );
            pr->pushed_ws = ct_none;
        }
    }

    switch ( schedule ) {
    #if  ( KMP_STATIC_STEAL_ENABLED && KMP_ARCH_X86_64 )
    case kmp_sch_static_steal:
        {
            T nproc = team->t.t_nproc;
            T ntc, init;

            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_steal case\n", gtid ) );

            ntc = (tc % chunk ? 1 : 0) + tc / chunk;
            if ( nproc > 1 && ntc >= nproc ) {
                T id = __kmp_tid_from_gtid(gtid);
                T small_chunk, extras;

                small_chunk = ntc / nproc;
                extras = ntc % nproc;

                init = id * small_chunk + ( id < extras ? id : extras );
                pr->u.p.count = init;
                pr->u.p.ub = init + small_chunk + ( id < extras ? 1 : 0 );

                pr->u.p.parm2 = lb;
                //pr->pfields.parm3 = 0; // it's not used in static_steal
                pr->u.p.parm4 = id;
                pr->u.p.st = st;
                break;
            } else {
                KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_balanced\n",
                               gtid ) );
                schedule = kmp_sch_static_balanced;
                /* too few iterations: fall-through to kmp_sch_static_balanced */
            } // if
            /* FALL-THROUGH to static balanced */
        } // case
    #endif
    case kmp_sch_static_balanced:
        {
            T nproc = team->t.t_nproc;
            T init, limit;

            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_balanced case\n",
                            gtid ) );

            if ( nproc > 1 ) {
                T id = __kmp_tid_from_gtid(gtid);

                if ( tc < nproc ) {
                    if ( id < tc ) {
                        init = id;
                        limit = id;
                        pr->u.p.parm1 = (id == tc - 1);  /* parm1 stores *plastiter */
                    } else {
                        pr->u.p.count = 1;  /* means no more chunks to execute */
                        pr->u.p.parm1 = FALSE;
                        break;
                    }
                } else {
                    T small_chunk = tc / nproc;
                    T extras = tc % nproc;
                    init = id * small_chunk + (id < extras ? id : extras);
                    limit = init + small_chunk - (id < extras ? 0 : 1);
                    pr->u.p.parm1 = (id == nproc - 1);
                }
            } else {
                if ( tc > 0 ) {
                    init = 0;
                    limit = tc - 1;
                    pr->u.p.parm1 = TRUE;
                } else {
                    // zero trip count
                    pr->u.p.count = 1;  /* means no more chunks to execute */
                    pr->u.p.parm1 = FALSE;
                    break;
                }
            }
#if USE_ITT_BUILD
            // Calculate chunk for metadata report
            if ( itt_need_metadata_reporting )
                cur_chunk = limit - init + 1;
#endif
            if ( st == 1 ) {
                pr->u.p.lb = lb + init;
                pr->u.p.ub = lb + limit;
            } else {
                T ub_tmp = lb + limit * st;   // calculated upper bound, "ub" is user-defined upper bound
                pr->u.p.lb = lb + init * st;
                // adjust upper bound to "ub" if needed, so that MS lastprivate will match it exactly
                if ( st > 0 ) {
                    pr->u.p.ub = ( ub_tmp + st > ub ? ub : ub_tmp );
                } else {
                    pr->u.p.ub = ( ub_tmp + st < ub ? ub : ub_tmp );
                }
            }
            if ( pr->ordered ) {
                pr->u.p.ordered_lower = init;
                pr->u.p.ordered_upper = limit;
            }
            break;
        } // case
    case kmp_sch_guided_iterative_chunked :
        {
            T nproc = team->t.t_nproc;
            KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_guided_iterative_chunked case\n",gtid));

            if ( nproc > 1 ) {
                if ( (2L * chunk + 1 ) * nproc >= tc ) {
                    /* chunk size too large, switch to dynamic */
                    schedule = kmp_sch_dynamic_chunked;
                } else {
                    // when remaining iters become less than parm2 - switch to dynamic
                    pr->u.p.parm2 = guided_int_param * nproc * ( chunk + 1 );
                    *(double*)&pr->u.p.parm3 = guided_flt_param / nproc;   // may occupy parm3 and parm4
                }
            } else {
                KD_TRACE(100,("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_greedy\n",gtid));
                schedule = kmp_sch_static_greedy;
                /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
                KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",gtid));
                pr->u.p.parm1 = tc;
            } // if
        } // case
        break;
    case kmp_sch_guided_analytical_chunked:
        {
            T nproc = team->t.t_nproc;
            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_analytical_chunked case\n", gtid));

            if ( nproc > 1 ) {
                if ( (2L * chunk + 1 ) * nproc >= tc ) {
                    /* chunk size too large, switch to dynamic */
                    schedule = kmp_sch_dynamic_chunked;
                } else {
                    /* commonly used term: (2 nproc - 1)/(2 nproc) */
                    DBL x;

                    #if KMP_OS_WINDOWS && KMP_ARCH_X86
                    /* Linux* OS already has 64-bit computation by default for
		       long double, and on Windows* OS on Intel(R) 64,
		       /Qlong_double doesn't work.  On Windows* OS
		       on IA-32 architecture, we need to set precision to
		       64-bit instead of the default 53-bit. Even though long
		       double doesn't work on Windows* OS on Intel(R) 64, the
		       resulting lack of precision is not expected to impact
		       the correctness of the algorithm, but this has not been
		       mathematically proven.
                    */
                    // save original FPCW and set precision to 64-bit, as
                    // Windows* OS on IA-32 architecture defaults to 53-bit
                    unsigned int oldFpcw = _control87(0,0);
                    _control87(_PC_64,_MCW_PC); // 0,0x30000
                    #endif
                    /* value used for comparison in solver for cross-over point */
                    long double target = ((long double)chunk * 2 + 1) * nproc / tc;

                    /* crossover point--chunk indexes equal to or greater than
		       this point switch to dynamic-style scheduling */
                    UT   cross;

                    /* commonly used term: (2 nproc - 1)/(2 nproc) */
                    x = (long double)1.0 - (long double)0.5 / nproc;

                    #ifdef KMP_DEBUG
                    { // test natural alignment
                        struct _test_a {
                            char a;
                            union {
                                char b;
                                DBL  d;
                            };
                        } t;
                        ptrdiff_t natural_alignment = (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
                        //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long long)natural_alignment );
                        KMP_DEBUG_ASSERT( ( ( (ptrdiff_t)&pr->u.p.parm3 ) & ( natural_alignment ) ) == 0 );
                    }
                    #endif // KMP_DEBUG

                    /* save the term in thread private dispatch structure */
                    *(DBL*)&pr->u.p.parm3 = x;

                    /* solve for the crossover point to the nearest integer i for which C_i <= chunk */
                    {
                        UT          left, right, mid;
                        long double p;

                        /* estimate initial upper and lower bound */

                        /* doesn't matter what value right is as long as it is positive, but
                           it affects performance of the solver
                        */
                        right = 229;
                        p = __kmp_pow< UT >(x,right);
                        if ( p > target ) {
                            do{
                                p *= p;
                                right <<= 1;
                            } while(p>target && right < (1<<27));
                            left = right >> 1; /* lower bound is previous (failed) estimate of upper bound */
                        } else {
                            left = 0;
                        }

                        /* bisection root-finding method */
                        while ( left + 1 < right ) {
                            mid = (left + right) / 2;
                            if ( __kmp_pow< UT >(x,mid) > target ) {
                                left = mid;
                            } else {
                                right = mid;
                            }
                        } // while
                        cross = right;
                    }
                    /* assert sanity of computed crossover point */
                    KMP_ASSERT(cross && __kmp_pow< UT >(x, cross - 1) > target && __kmp_pow< UT >(x, cross) <= target);

                    /* save the crossover point in thread private dispatch structure */
                    pr->u.p.parm2 = cross;

                    // C75803
                    #if ( ( KMP_OS_LINUX || KMP_OS_WINDOWS ) && KMP_ARCH_X86 ) && ( ! defined( KMP_I8 ) )
                        #define GUIDED_ANALYTICAL_WORKAROUND (*( DBL * )&pr->u.p.parm3)
                    #else
                        #define GUIDED_ANALYTICAL_WORKAROUND (x)
                    #endif
                    /* dynamic-style scheduling offset */
                    pr->u.p.count = tc - __kmp_dispatch_guided_remaining(tc, GUIDED_ANALYTICAL_WORKAROUND, cross) - cross * chunk;
                    #if KMP_OS_WINDOWS && KMP_ARCH_X86
                        // restore FPCW
                        _control87(oldFpcw,_MCW_PC);
                    #endif
                } // if
            } else {
                KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_greedy\n",
                               gtid ) );
                schedule = kmp_sch_static_greedy;
                /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
                pr->u.p.parm1 = tc;
            } // if
        } // case
        break;
    case kmp_sch_static_greedy:
        KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",gtid));
            pr->u.p.parm1 = ( team -> t.t_nproc > 1 ) ?
                ( tc + team->t.t_nproc - 1 ) / team->t.t_nproc :
                tc;
        break;
    case kmp_sch_static_chunked :
    case kmp_sch_dynamic_chunked :
        if ( pr->u.p.parm1 <= 0 ) {
            pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
        }
        KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n", gtid));
        break;
    case kmp_sch_trapezoidal :
        {
            /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

            T parm1, parm2, parm3, parm4;
            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_trapezoidal case\n", gtid ) );

            parm1 = chunk;

            /* F : size of the first cycle */
            parm2 = ( tc / (2 * team->t.t_nproc) );

            if ( parm2 < 1 ) {
                parm2 = 1;
            }

            /* L : size of the last cycle.  Make sure the last cycle
             *     is not larger than the first cycle.
             */
            if ( parm1 < 1 ) {
                parm1 = 1;
            } else if ( parm1 > parm2 ) {
                parm1 = parm2;
            }

            /* N : number of cycles */
            parm3 = ( parm2 + parm1 );
            parm3 = ( 2 * tc + parm3 - 1) / parm3;

            if ( parm3 < 2 ) {
                parm3 = 2;
            }

            /* sigma : decreasing incr of the trapezoid */
            parm4 = ( parm3 - 1 );
            parm4 = ( parm2 - parm1 ) / parm4;

            // pointless check, because parm4 >= 0 always
            //if ( parm4 < 0 ) {
            //    parm4 = 0;
            //}

            pr->u.p.parm1 = parm1;
            pr->u.p.parm2 = parm2;
            pr->u.p.parm3 = parm3;
            pr->u.p.parm4 = parm4;
        } // case
        break;

    default:
        {
            __kmp_msg(
                kmp_ms_fatal,                        // Severity
                KMP_MSG( UnknownSchedTypeDetected ), // Primary message
                KMP_HNT( GetNewerLibrary ),          // Hint
                __kmp_msg_null                       // Variadic argument list terminator
            );
        }
        break;
    } // switch
    pr->schedule = schedule;
    if ( active ) {
        /* The name of this buffer should be my_buffer_index when it's free to use it */

        KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d sh->buffer_index:%d\n",
                        gtid, my_buffer_index, sh->buffer_index) );
        __kmp_wait_yield< kmp_uint32 >( & sh->buffer_index, my_buffer_index, __kmp_eq< kmp_uint32 >
                                        USE_ITT_BUILD_ARG( NULL )
                                        );
            // Note: KMP_WAIT_YIELD() cannot be used there: buffer index and my_buffer_index are
            // *always* 32-bit integers.
        KMP_MB();  /* is this necessary? */
        KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d sh->buffer_index:%d\n",
                        gtid, my_buffer_index, sh->buffer_index) );

        th -> th.th_dispatch -> th_dispatch_pr_current = (dispatch_private_info_t*) pr;
        th -> th.th_dispatch -> th_dispatch_sh_current = (dispatch_shared_info_t*)  sh;
#if USE_ITT_BUILD
        if ( pr->ordered ) {
            __kmp_itt_ordered_init( gtid );
        }; // if
        // Report loop metadata
        if ( itt_need_metadata_reporting ) {
            // Only report metadata by master of active team at level 1
            kmp_uint64 schedtype = 0;
            switch ( schedule ) {
            case kmp_sch_static_chunked:
            case kmp_sch_static_balanced:// Chunk is calculated in the switch above
                break;
            case kmp_sch_static_greedy:
                cur_chunk = pr->u.p.parm1;
                break;
            case kmp_sch_dynamic_chunked:
                schedtype = 1;
                break;
            case kmp_sch_guided_iterative_chunked:
            case kmp_sch_guided_analytical_chunked:
                schedtype = 2;
                break;
            default:
//            Should we put this case under "static"?
//            case kmp_sch_static_steal:
                schedtype = 3;
                break;
            }
            __kmp_itt_metadata_loop(loc, schedtype, tc, cur_chunk);
        }
#endif /* USE_ITT_BUILD */
    }; // if

    #ifdef KMP_DEBUG
    {
        const char * buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s lb:%%%s ub:%%%s" \
            " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s" \
            " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
            traits_t< UT >::spec, traits_t< T >::spec, traits_t< T >::spec,
            traits_t< ST >::spec, traits_t< UT >::spec, traits_t< UT >::spec,
            traits_t< UT >::spec, traits_t< UT >::spec, traits_t< T >::spec,
            traits_t< T >::spec, traits_t< T >::spec, traits_t< T >::spec );
        KD_TRACE(10, ( buff,
            gtid, pr->schedule, pr->ordered, pr->u.p.lb, pr->u.p.ub,
            pr->u.p.st, pr->u.p.tc, pr->u.p.count,
            pr->u.p.ordered_lower, pr->u.p.ordered_upper, pr->u.p.parm1,
            pr->u.p.parm2, pr->u.p.parm3, pr->u.p.parm4 ) );
        __kmp_str_free( &buff );
    }
    #endif
    #if ( KMP_STATIC_STEAL_ENABLED )
    if ( ___kmp_size_type < 8 ) {
      // It cannot be guaranteed that after execution of a loop with some other schedule kind
      // all the parm3 variables will contain the same value.
      // Even if all parm3 will be the same, it still exists a bad case like using 0 and 1
      // rather than program life-time increment.
      // So the dedicated variable is required. The 'static_steal_counter' is used.
      if( schedule == kmp_sch_static_steal ) {
        // Other threads will inspect this variable when searching for a victim.
        // This is a flag showing that other threads may steal from this thread since then.
        volatile T * p = &pr->u.p.static_steal_counter;
        *p = *p + 1;
      }
    }
    #endif // ( KMP_STATIC_STEAL_ENABLED && USE_STEALING )

#if OMPT_SUPPORT && OMPT_TRACE
    if (ompt_enabled &&
        ompt_callbacks.ompt_callback(ompt_event_loop_begin)) {
        ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
        ompt_task_info_t *task_info = __ompt_get_taskinfo(0);
        ompt_callbacks.ompt_callback(ompt_event_loop_begin)(
            team_info->parallel_id, task_info->task_id, team_info->microtask);
    }
#endif
}